

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int gost_imit_ctrl(EVP_MD_CTX *ctx,int type,int arg,void *ptr)

{
  int iVar1;
  ASN1_OBJECT *obj;
  EVP_MD *pEVar2;
  code *pcVar3;
  gost_cipher_info *pgVar4;
  long lVar5;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  EVP_MD_CTX *in_RDI;
  ossl_gost_imit_ctx *c;
  gost_cipher_info *param;
  gost_mac_key *key;
  ossl_gost_imit_ctx *gost_imit_ctx;
  undefined4 in_stack_ffffffffffffffb8;
  gost_ctx *in_stack_ffffffffffffffc0;
  int local_4;
  
  if (in_ESI == 3) {
    lVar5 = EVP_MD_CTX_get0_md_data(in_RDI);
    if ((in_EDX < 1) || (8 < in_EDX)) {
      ERR_GOST_error((int)((ulong)lVar5 >> 0x20),(int)lVar5,
                     (char *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),0);
      local_4 = 0;
    }
    else {
      *(int *)(lVar5 + 0x1080) = in_EDX;
      local_4 = 1;
    }
  }
  else if (in_ESI == 0x1003) {
    *in_RCX = 0x20;
    local_4 = 1;
  }
  else if (in_ESI == 0x1004) {
    obj = (ASN1_OBJECT *)EVP_MD_CTX_get0_md_data(in_RDI);
    pEVar2 = EVP_MD_CTX_md(in_RDI);
    pcVar3 = (code *)EVP_MD_meth_get_init(pEVar2);
    iVar1 = (*pcVar3)(in_RDI);
    if (iVar1 < 1) {
      ERR_GOST_error((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0,
                     (char *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),0);
      local_4 = 0;
    }
    else {
      EVP_MD_CTX_set_flags(in_RDI,0x100);
      if (in_EDX == 0) {
        if (*in_RCX != 0) {
          OBJ_nid2obj(*in_RCX);
          pgVar4 = get_encryption_params(obj);
          if (pgVar4 == (gost_cipher_info *)0x0) {
            ERR_GOST_error((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                           (int)in_stack_ffffffffffffffc0,
                           (char *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),0);
            return 0;
          }
          gost_init(in_stack_ffffffffffffffc0,
                    (gost_subst_block *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8));
        }
        gost_key(in_stack_ffffffffffffffc0,(byte *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8));
        *(undefined4 *)(obj + 0x107c) = 1;
        local_4 = 1;
      }
      else if (in_EDX == 0x20) {
        gost_key(in_stack_ffffffffffffffc0,(byte *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8));
        *(undefined4 *)(obj + 0x107c) = 1;
        local_4 = 1;
      }
      else {
        ERR_GOST_error((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                       (int)in_stack_ffffffffffffffc0,
                       (char *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),0);
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int gost_imit_ctrl(EVP_MD_CTX *ctx, int type, int arg, void *ptr)
{
    switch (type) {
    case EVP_MD_CTRL_KEY_LEN:
        *((unsigned int *)(ptr)) = 32;
        return 1;
    case EVP_MD_CTRL_SET_KEY:
        {
            struct ossl_gost_imit_ctx *gost_imit_ctx = EVP_MD_CTX_md_data(ctx);

            if (EVP_MD_meth_get_init(EVP_MD_CTX_md(ctx)) (ctx) <= 0) {
                GOSTerr(GOST_F_GOST_IMIT_CTRL, GOST_R_MAC_KEY_NOT_SET);
                return 0;
            }
            EVP_MD_CTX_set_flags(ctx, EVP_MD_CTX_FLAG_NO_INIT);

            if (arg == 0) {
                struct gost_mac_key *key = (struct gost_mac_key *)ptr;
                if (key->mac_param_nid != NID_undef) {
                    const struct gost_cipher_info *param =
                        get_encryption_params(OBJ_nid2obj(key->mac_param_nid));
                    if (param == NULL) {
                        GOSTerr(GOST_F_GOST_IMIT_CTRL,
                                GOST_R_INVALID_MAC_PARAMS);
                        return 0;
                    }
                    gost_init(&(gost_imit_ctx->cctx), param->sblock);
                }
                gost_key(&(gost_imit_ctx->cctx), key->key);
                gost_imit_ctx->key_set = 1;

                return 1;
            } else if (arg == 32) {
                gost_key(&(gost_imit_ctx->cctx), ptr);
                gost_imit_ctx->key_set = 1;
                return 1;
            }
            GOSTerr(GOST_F_GOST_IMIT_CTRL, GOST_R_INVALID_MAC_KEY_SIZE);
            return 0;
        }
    case EVP_MD_CTRL_XOF_LEN:
        {
            struct ossl_gost_imit_ctx *c = EVP_MD_CTX_md_data(ctx);
            if (arg < 1 || arg > 8) {
                GOSTerr(GOST_F_GOST_IMIT_CTRL, GOST_R_INVALID_MAC_SIZE);
                return 0;
            }
            c->dgst_size = arg;
            return 1;
        }

    default:
        return 0;
    }
}